

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strpool.h
# Opt level: O3

void strpool_init(strpool_t *pool,strpool_config_t *config)

{
  undefined8 *puVar1;
  int iVar2;
  strpool_internal_hash_slot_t *__s;
  strpool_internal_entry_t *psVar3;
  strpool_internal_handle_t *psVar4;
  strpool_internal_block_t *psVar5;
  strpool_config_t *psVar6;
  int iVar7;
  int iVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar12;
  uint uVar16;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  psVar6 = &strpool_default_config;
  if (config != (strpool_config_t *)0x0) {
    psVar6 = config;
  }
  puVar1 = (undefined8 *)psVar6->memctx;
  pool->memctx = puVar1;
  pool->ignore_case = psVar6->ignore_case;
  iVar2 = psVar6->counter_bits;
  iVar7 = psVar6->index_bits;
  if (0x40 < iVar2 + iVar7) {
    __assert_fail("config->counter_bits + config->index_bits <= 64",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x22b,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  pool->counter_shift = iVar7;
  pool->counter_mask = ~(-1L << ((byte)iVar2 & 0x3f));
  pool->index_mask = ~(-1L << ((byte)iVar7 & 0x3f));
  uVar12 = -(uint)(2 < psVar6->entry_capacity);
  uVar16 = -(uint)(2 < psVar6->block_capacity);
  auVar13._0_4_ = (~uVar12 & 2 | psVar6->entry_capacity & uVar12) - 1;
  auVar13._4_4_ = (~uVar16 & 2 | psVar6->block_capacity & uVar16) - 1;
  auVar13._8_4_ = 0xffffffff;
  auVar13._12_4_ = 0xffffffff;
  auVar8._0_4_ = auVar13._0_4_ >> 1;
  auVar8._4_4_ = auVar13._4_4_ >> 1;
  auVar8._8_4_ = 0x7fffffff;
  auVar8._12_4_ = 0x7fffffff;
  auVar8 = auVar8 | auVar13;
  auVar14._0_4_ = auVar8._0_4_ >> 2;
  auVar14._4_4_ = auVar8._4_4_ >> 2;
  auVar14._8_4_ = auVar8._8_4_ >> 2;
  auVar14._12_4_ = auVar8._12_4_ >> 2;
  auVar14 = auVar14 | auVar8;
  auVar9._0_4_ = auVar14._0_4_ >> 4;
  auVar9._4_4_ = auVar14._4_4_ >> 4;
  auVar9._8_4_ = auVar14._8_4_ >> 4;
  auVar9._12_4_ = auVar14._12_4_ >> 4;
  auVar9 = auVar9 | auVar14;
  auVar15._0_4_ = auVar9._0_4_ >> 8;
  auVar15._4_4_ = auVar9._4_4_ >> 8;
  auVar15._8_4_ = auVar9._8_4_ >> 8;
  auVar15._12_4_ = auVar9._12_4_ >> 8;
  auVar15 = auVar15 | auVar9;
  auVar10._0_4_ = auVar15._0_4_ >> 0x10;
  auVar10._4_4_ = auVar15._4_4_ >> 0x10;
  auVar10._8_4_ = auVar15._8_4_ >> 0x10;
  auVar10._12_4_ = auVar15._12_4_ >> 0x10;
  iVar7 = SUB164(auVar10 | auVar15,0) + 1;
  iVar11 = SUB164(auVar10 | auVar15,4) + 1;
  pool->initial_entry_capacity = iVar7;
  pool->initial_block_capacity = iVar11;
  iVar2 = 0x100;
  if (0x100 < psVar6->block_size) {
    iVar2 = psVar6->block_size;
  }
  uVar12 = iVar2 - 1U >> 1 | iVar2 - 1U;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  pool->block_size = (uVar12 >> 0x10 | uVar12) + 1;
  iVar2 = 0x11;
  if (8 < psVar6->min_length) {
    iVar2 = psVar6->min_length + 9;
  }
  pool->min_data_size = iVar2;
  pool->hash_capacity = iVar7 * 2;
  pool->entry_capacity = iVar7;
  pool->handle_capacity = iVar7;
  pool->block_capacity = iVar11;
  pool->handle_freelist_tail = -1;
  pool->block_count = 0;
  pool->handle_count = 0;
  pool->handle_freelist_head = -1;
  pool->entry_count = 0;
  __s = (strpool_internal_hash_slot_t *)
        (*(code *)*puVar1)(0,(long)(iVar7 * 2) * 0xc,0,0,0,0,puVar1[1]);
  pool->hash_table = __s;
  if (__s != (strpool_internal_hash_slot_t *)0x0) {
    memset(__s,0,(long)pool->hash_capacity * 0xc);
    psVar3 = (strpool_internal_entry_t *)
             (**pool->memctx)(0,(long)pool->entry_capacity << 5,0,0,0,0,
                              *(undefined8 *)((long)pool->memctx + 8));
    pool->entries = psVar3;
    if (psVar3 == (strpool_internal_entry_t *)0x0) {
      __assert_fail("pool->entries",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x24a,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    psVar4 = (strpool_internal_handle_t *)
             (**pool->memctx)(0,(long)pool->handle_capacity << 3,0,0,0,0,
                              *(undefined8 *)((long)pool->memctx + 8));
    pool->handles = psVar4;
    if (psVar4 != (strpool_internal_handle_t *)0x0) {
      psVar5 = (strpool_internal_block_t *)
               (**pool->memctx)(0,(long)pool->block_capacity << 5,0,0,0,0,
                                *(undefined8 *)((long)pool->memctx + 8));
      pool->blocks = psVar5;
      if (psVar5 != (strpool_internal_block_t *)0x0) {
        iVar2 = strpool_internal_add_block(pool,pool->block_size);
        pool->current_block = iVar2;
        return;
      }
      __assert_fail("pool->blocks",
                    "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                    ,0x250,"void strpool_init(strpool_t *, const strpool_config_t *)");
    }
    __assert_fail("pool->handles",
                  "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                  ,0x24d,"void strpool_init(strpool_t *, const strpool_config_t *)");
  }
  __assert_fail("pool->hash_table",
                "/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/../3rdparty/mattias/strpool.h"
                ,0x246,"void strpool_init(strpool_t *, const strpool_config_t *)");
}

Assistant:

void strpool_init( strpool_t* pool, strpool_config_t const* config )
    {
    if( !config ) config = &strpool_default_config;

    pool->memctx = config->memctx;
    pool->ignore_case = config->ignore_case;

    STRPOOL_ASSERT( config->counter_bits + config->index_bits <= 64 );
    pool->counter_shift = config->index_bits;
    pool->counter_mask = ( 1ULL << (STRPOOL_U64) config->counter_bits ) - 1;
    pool->index_mask = ( 1ULL << (STRPOOL_U64) config->index_bits ) - 1;

    pool->initial_entry_capacity = 
        (int) strpool_internal_pow2ceil( config->entry_capacity > 1 ? (STRPOOL_U32)config->entry_capacity : 2U );
    pool->initial_block_capacity = 
        (int) strpool_internal_pow2ceil( config->block_capacity > 1 ? (STRPOOL_U32)config->block_capacity : 2U );
    pool->block_size = 
        (int) strpool_internal_pow2ceil( config->block_size > 256 ? (STRPOOL_U32)config->block_size : 256U );
    pool->min_data_size = 
        (int) ( sizeof( int ) * 2 + 1 + ( config->min_length > 8 ? (STRPOOL_U32)config->min_length : 8U ) );

    pool->hash_capacity = pool->initial_entry_capacity * 2;
    pool->entry_capacity = pool->initial_entry_capacity;
    pool->handle_capacity = pool->initial_entry_capacity;
    pool->block_capacity = pool->initial_block_capacity;    

    pool->handle_freelist_head = -1;
    pool->handle_freelist_tail = -1;
    pool->block_count = 0;
    pool->handle_count = 0;
    pool->entry_count = 0;
    
    pool->hash_table = (strpool_internal_hash_slot_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->hash_capacity * sizeof( *pool->hash_table ) );
    STRPOOL_ASSERT( pool->hash_table );
    STRPOOL_MEMSET( pool->hash_table, 0, pool->hash_capacity * sizeof( *pool->hash_table ) );
    pool->entries = (strpool_internal_entry_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->entry_capacity * sizeof( *pool->entries ) );
    STRPOOL_ASSERT( pool->entries );
    pool->handles = (strpool_internal_handle_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->handle_capacity * sizeof( *pool->handles ) );
    STRPOOL_ASSERT( pool->handles );
    pool->blocks = (strpool_internal_block_t*) STRPOOL_MALLOC( pool->memctx, 
        pool->block_capacity * sizeof( *pool->blocks ) );
    STRPOOL_ASSERT( pool->blocks );

    pool->current_block = strpool_internal_add_block( pool, pool->block_size );
    }